

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O0

int __thiscall cmVSLink::LinkIncremental(cmVSLink *this)

{
  byte bVar1;
  int mtRet_00;
  ostream *poVar2;
  char *pcVar3;
  ulong uVar4;
  bool bVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  int local_490;
  byte local_48a;
  allocator<char> local_489;
  int mtRet;
  undefined1 local_468 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rcCommand;
  ofstream foutTmp;
  undefined1 local_248 [8];
  ofstream fout;
  undefined1 local_38 [8];
  string absManifestFile;
  cmVSLink *this_local;
  
  absManifestFile.field_2._8_8_ = this;
  cmsys::SystemTools::CollapseFullPath((string *)local_38,&this->ManifestFile);
  if ((this->Verbose & 1U) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Create ");
    poVar2 = std::operator<<(poVar2,(string *)&this->ManifestFileRC);
    std::operator<<(poVar2,"\n");
  }
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_248,pcVar3,_S_out);
  bVar1 = std::ios::operator!((ios *)(local_248 + (long)*(_func_int **)((long)local_248 + -0x18)));
  bVar5 = (bVar1 & 1) != 0;
  if (bVar5) {
    this_local._4_4_ = -1;
  }
  else {
    std::operator<<((ostream *)local_248,"#pragma code_page(65001)\n");
    poVar2 = (ostream *)std::ostream::operator<<(local_248,this->Type);
    poVar2 = std::operator<<(poVar2,
                             " /* CREATEPROCESS_MANIFEST_RESOURCE_ID */ 24 /* RT_MANIFEST */ \"");
    poVar2 = std::operator<<(poVar2,(string *)local_38);
    std::operator<<(poVar2,"\"");
  }
  std::ofstream::~ofstream(local_248);
  if (!bVar5) {
    bVar5 = cmsys::SystemTools::FileExists(&this->ManifestFile);
    if (!bVar5) {
      if ((this->Verbose & 1U) != 0) {
        poVar2 = std::operator<<((ostream *)&std::cout,"Create empty: ");
        poVar2 = std::operator<<(poVar2,(string *)&this->ManifestFile);
        std::operator<<(poVar2,"\n");
      }
      pcVar3 = (char *)std::__cxx11::string::c_str();
      std::ofstream::ofstream
                (&rcCommand.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,pcVar3,_S_out);
      std::ofstream::~ofstream
                (&rcCommand.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_468);
    uVar4 = std::__cxx11::string::empty();
    local_48a = 0;
    if ((uVar4 & 1) == 0) {
      std::__cxx11::string::string((string *)&mtRet,(string *)&this->RcPath);
    }
    else {
      std::allocator<char>::allocator();
      local_48a = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&mtRet,"rc",&local_489);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_468,(value_type *)&mtRet);
    std::__cxx11::string::~string((string *)&mtRet);
    if ((local_48a & 1) != 0) {
      std::allocator<char>::~allocator(&local_489);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[4]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_468,
               (char (*) [4])"/fo");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_468,&this->ManifestFileRes);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_468,&this->ManifestFileRC);
    bVar5 = RunCommand("RC Pass 1",
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_468,(bool)(this->Verbose & 1),FORMAT_DECIMAL,(int *)0x0,
                       (_func_bool_int *)0x0);
    if (bVar5) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->LinkCommand,&this->ManifestFileRes);
      bVar5 = RunCommand("LINK Pass 1",&this->LinkCommand,(bool)(this->Verbose & 1),FORMAT_DECIMAL,
                         (int *)0x0,(_func_bool_int *)0x0);
      if (bVar5) {
        std::operator+(&local_4b0,"/out:",&this->ManifestFile);
        mtRet_00 = RunMT(this,&local_4b0,true);
        std::__cxx11::string::~string((string *)&local_4b0);
        local_490 = mtRet_00;
        bVar5 = mtRetIsUpdate(mtRet_00);
        if (bVar5) {
          bVar5 = RunCommand("RC Pass 2",
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_468,(bool)(this->Verbose & 1),FORMAT_DECIMAL,(int *)0x0,
                             (_func_bool_int *)0x0);
          if (bVar5) {
            bVar5 = RunCommand("FINAL LINK",&this->LinkCommand,(bool)(this->Verbose & 1),
                               FORMAT_DECIMAL,(int *)0x0,(_func_bool_int *)0x0);
            if (bVar5) {
              this_local._4_4_ = 0;
            }
            else {
              this_local._4_4_ = -1;
            }
          }
          else {
            this_local._4_4_ = -1;
          }
        }
        else {
          this_local._4_4_ = local_490;
        }
      }
      else {
        this_local._4_4_ = -1;
      }
    }
    else {
      this_local._4_4_ = -1;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_468);
  }
  std::__cxx11::string::~string((string *)local_38);
  return this_local._4_4_;
}

Assistant:

int cmVSLink::LinkIncremental()
{
  // This follows the steps listed here:
  // http://blogs.msdn.com/zakramer/archive/2006/05/22/603558.aspx

  //    1.  Compiler compiles the application and generates the *.obj files.
  //    2.  An empty manifest file is generated if this is a clean build and if
  //    not the previous one is reused.
  //    3.  The resource compiler (rc.exe) compiles the *.manifest file to a
  //    *.res file.
  //    4.  Linker generates the binary (EXE or DLL) with the /incremental
  //    switch and embeds the dummy manifest file. The linker also generates
  //    the real manifest file based on the binaries that your binary depends
  //    on.
  //    5.  The manifest tool (mt.exe) is then used to generate the final
  //    manifest.

  // If the final manifest is changed, then 6 and 7 are run, if not
  // they are skipped, and it is done.

  //    6.  The resource compiler is invoked one more time.
  //    7.  Finally, the Linker does another incremental link, but since the
  //    only thing that has changed is the *.res file that contains the
  //    manifest it is a short link.

  // Create a resource file referencing the manifest.
  std::string absManifestFile =
    cmSystemTools::CollapseFullPath(this->ManifestFile);
  if (this->Verbose) {
    std::cout << "Create " << this->ManifestFileRC << "\n";
  }
  {
    cmsys::ofstream fout(this->ManifestFileRC.c_str());
    if (!fout) {
      return -1;
    }
    // Insert a pragma statement to specify utf-8 encoding.
    fout << "#pragma code_page(65001)\n";
    fout << this->Type
         << " /* CREATEPROCESS_MANIFEST_RESOURCE_ID */ "
            "24 /* RT_MANIFEST */ \""
         << absManifestFile << "\"";
  }

  // If we have not previously generated a manifest file,
  // generate an empty one so the resource compiler succeeds.
  if (!cmSystemTools::FileExists(this->ManifestFile)) {
    if (this->Verbose) {
      std::cout << "Create empty: " << this->ManifestFile << "\n";
    }
    cmsys::ofstream foutTmp(this->ManifestFile.c_str());
  }

  // Compile the resource file.
  std::vector<std::string> rcCommand;
  rcCommand.push_back(this->RcPath.empty() ? "rc" : this->RcPath);
  rcCommand.emplace_back("/fo");
  rcCommand.push_back(this->ManifestFileRes);
  rcCommand.push_back(this->ManifestFileRC);
  if (!RunCommand("RC Pass 1", rcCommand, this->Verbose, FORMAT_DECIMAL)) {
    return -1;
  }

  // Tell the linker to use our manifest compiled into a resource.
  this->LinkCommand.push_back(this->ManifestFileRes);

  // Run the link command (possibly generates intermediate manifest).
  if (!RunCommand("LINK Pass 1", this->LinkCommand, this->Verbose,
                  FORMAT_DECIMAL)) {
    return -1;
  }

  // Run the manifest tool to create the final manifest.
  int mtRet = this->RunMT("/out:" + this->ManifestFile, true);

  // If mt returns a special value then it updated the manifest file so
  // we need to embed it again.  Otherwise we are done.
  if (!mtRetIsUpdate(mtRet)) {
    return mtRet;
  }

  // Compile the resource file again.
  if (!RunCommand("RC Pass 2", rcCommand, this->Verbose, FORMAT_DECIMAL)) {
    return -1;
  }

  // Link incrementally again to use the updated resource.
  if (!RunCommand("FINAL LINK", this->LinkCommand, this->Verbose,
                  FORMAT_DECIMAL)) {
    return -1;
  }
  return 0;
}